

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

Aig_Man_t * Saig_ManDupWithCubes(Aig_Man_t *pAig,Vec_Vec_t *vReg2Value)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Man_t *p;
  char *pcVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  Vec_Int_t *p_00;
  int iVar7;
  int i;
  int iVar8;
  int Counter;
  int iVar9;
  int iVar10;
  
  if (pAig->nConstrs == 0) {
    iVar7 = pAig->nObjs[5];
    iVar10 = pAig->nObjs[6];
    iVar9 = 0;
    for (iVar8 = 0; iVar8 < vReg2Value->nSize; iVar8 = iVar8 + 1) {
      pVVar2 = Vec_VecEntry(vReg2Value,iVar8);
      iVar9 = iVar9 + pVVar2->nSize;
    }
    p = Aig_ManStart(iVar10 + iVar7 + iVar9);
    pcVar3 = Abc_UtilStrsav(pAig->pName);
    p->pName = pcVar3;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    for (iVar7 = 0; iVar7 < pAig->vCis->nSize; iVar7 = iVar7 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,iVar7);
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
    }
    for (iVar7 = 0; iVar7 < pAig->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar7);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        p1 = Aig_ObjChild1Copy(pAVar5);
        pAVar6 = Aig_And(p,pAVar6,p1);
        (pAVar5->field_5).pData = pAVar6;
      }
    }
    for (iVar7 = 0; iVar7 < vReg2Value->nSize; iVar7 = iVar7 + 1) {
      p_00 = Vec_VecEntryInt(vReg2Value,iVar7);
      pAVar5 = p->pConst1;
      for (iVar10 = 0; iVar10 < p_00->nSize; iVar10 = iVar10 + 1) {
        iVar8 = Vec_IntEntry(p_00,iVar10);
        iVar9 = Abc_Lit2Var(iVar8);
        pAVar6 = Saig_ManLi(pAig,iVar9);
        pAVar6 = Aig_ObjChild0Copy(pAVar6);
        uVar1 = Abc_LitIsCompl(iVar8);
        pAVar5 = Aig_And(p,pAVar5,(Aig_Obj_t *)((ulong)uVar1 ^ (ulong)pAVar6));
      }
      Aig_ObjCreateCo(p,pAVar5);
    }
    for (iVar7 = 0; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar7);
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      Aig_ObjCreateCo(p,pAVar5);
    }
    Aig_ManCleanup(p);
    Aig_ManSetRegNum(p,pAig->nRegs);
    return p;
  }
  __assert_fail("pAig->nConstrs == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                ,0x98,"Aig_Man_t *Saig_ManDupWithCubes(Aig_Man_t *, Vec_Vec_t *)");
}

Assistant:

Aig_Man_t * Saig_ManDupWithCubes( Aig_Man_t * pAig, Vec_Vec_t * vReg2Value )
{
    Vec_Int_t * vLevel;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pMiter;
    int i, k, Lit;
    assert( pAig->nConstrs == 0 );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) + Vec_VecSizeSize(vReg2Value) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create POs for cubes
    Vec_VecForEachLevelInt( vReg2Value, vLevel, i )
    {
        pMiter = Aig_ManConst1( pAigNew );
        Vec_IntForEachEntry( vLevel, Lit, k )
        {
            pObj = Saig_ManLi( pAig, Abc_Lit2Var(Lit) );
            pMiter = Aig_And( pAigNew, pMiter, Aig_NotCond(Aig_ObjChild0Copy(pObj), Abc_LitIsCompl(Lit)) );
        }
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // finalize
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}